

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O0

NODE * deletemin(NODE **p)

{
  NODE *pNVar1;
  NODE *x;
  NODE **p_local;
  
  for (x = (NODE *)p; *(long *)(*(long *)x + 8) != 0; x = (NODE *)(*(long *)x + 8)) {
  }
  pNVar1 = *(NODE **)x;
  *(undefined8 *)x = *(undefined8 *)(*(long *)x + 0x10);
  return pNVar1;
}

Assistant:

NODE *deletemin(NODE **p) {
  NODE *x;
  while ((*p)->left != NULL) {
    p = &(*p)->left;
  }

  x = *p;
  *p = (*p)->right;
  return x;
}